

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O1

void __thiscall fasttext::DenseMatrix::load(DenseMatrix *this,istream *in)

{
  AlignedVector<float> local_48;
  
  std::istream::read((char *)in,(long)&(this->super_Matrix).m_);
  std::istream::read((char *)in,(long)&(this->super_Matrix).n_);
  intgemm::AlignedVector<float>::AlignedVector
            (&local_48,(this->super_Matrix).n_ * (this->super_Matrix).m_,0x40);
  if (&this->data_ != &local_48) {
    free((this->data_).mem_);
    (this->data_).mem_ = local_48.mem_;
    (this->data_).size_ = local_48.size_;
    local_48.mem_ = (float *)0x0;
    local_48.size_ = 0;
  }
  free(local_48.mem_);
  std::istream::read((char *)in,(long)(this->data_).mem_);
  return;
}

Assistant:

void DenseMatrix::load(std::istream& in) {
  in.read((char*)&m_, sizeof(int64_t));
  in.read((char*)&n_, sizeof(int64_t));
  data_ = intgemm::AlignedVector<real>(m_ * n_);
  in.read((char*)data_.data(), m_ * n_ * sizeof(real));
}